

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O2

void __thiscall
spvtools::opt::SENodeSimplifyImpl::GatherAccumulatorsFromChildNodes
          (SENodeSimplifyImpl *this,SENode *new_node,SENode *child,bool negation)

{
  long lVar1;
  pointer ppSVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  undefined4 extraout_var;
  long lVar6;
  uint uVar7;
  pointer ppSVar8;
  SENode *local_40;
  pair<spvtools::opt::SENode_*const,_long> local_38;
  
  while( true ) {
    local_40 = child;
    iVar4 = (**child->_vptr_SENode)(child);
    if (iVar4 == 0) {
      iVar4 = (*child->_vptr_SENode[4])(child);
      lVar1 = *(long *)(CONCAT44(extraout_var,iVar4) + 0x30);
      lVar6 = -lVar1;
      if ((negation & 1U) == 0) {
        lVar6 = lVar1;
      }
      this->constant_accumulator_ = this->constant_accumulator_ + lVar6;
      return;
    }
    iVar4 = (**child->_vptr_SENode)(child);
    if ((iVar4 == 5) || (iVar4 = (**child->_vptr_SENode)(child), iVar4 == 1)) {
      uVar7 = -(negation & 1) | 1;
      iVar5 = std::
              _Rb_tree<spvtools::opt::SENode_*,_std::pair<spvtools::opt::SENode_*const,_long>,_std::_Select1st<std::pair<spvtools::opt::SENode_*const,_long>_>,_std::less<spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*const,_long>_>_>
              ::find(&(this->accumulators_)._M_t,&local_40);
      if ((_Rb_tree_header *)iVar5._M_node !=
          &(this->accumulators_)._M_t._M_impl.super__Rb_tree_header) {
        iVar5._M_node[1]._M_parent =
             (_Base_ptr)((long)&(iVar5._M_node[1]._M_parent)->_M_color + (long)(int)uVar7);
        return;
      }
      local_38.first = local_40;
      local_38.second = (long)(int)uVar7;
      std::
      _Rb_tree<spvtools::opt::SENode*,std::pair<spvtools::opt::SENode*const,long>,std::_Select1st<std::pair<spvtools::opt::SENode*const,long>>,std::less<spvtools::opt::SENode*>,std::allocator<std::pair<spvtools::opt::SENode*const,long>>>
      ::_M_insert_unique<std::pair<spvtools::opt::SENode*const,long>>
                ((_Rb_tree<spvtools::opt::SENode*,std::pair<spvtools::opt::SENode*const,long>,std::_Select1st<std::pair<spvtools::opt::SENode*const,long>>,std::less<spvtools::opt::SENode*>,std::allocator<std::pair<spvtools::opt::SENode*const,long>>>
                  *)&this->accumulators_,&local_38);
      return;
    }
    iVar4 = (**child->_vptr_SENode)(child);
    if (iVar4 == 3) break;
    iVar4 = (**child->_vptr_SENode)(child);
    if (iVar4 == 2) {
      ppSVar2 = (child->children_).
                super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppSVar8 = (child->children_).
                     super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppSVar8 != ppSVar2;
          ppSVar8 = ppSVar8 + 1) {
        GatherAccumulatorsFromChildNodes(this,new_node,*ppSVar8,(bool)(negation & 1));
      }
      return;
    }
    iVar4 = (**child->_vptr_SENode)(child);
    if (iVar4 != 4) goto LAB_004fdfdc;
    child = *(child->children_).
             super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
    negation = (bool)(negation ^ 1);
  }
  bVar3 = AccumulatorsFromMultiply(this,child,(bool)(negation & 1));
  if (bVar3) {
    return;
  }
LAB_004fdfdc:
  (*new_node->_vptr_SENode[3])(new_node,child);
  return;
}

Assistant:

void SENodeSimplifyImpl::GatherAccumulatorsFromChildNodes(SENode* new_node,
                                                          SENode* child,
                                                          bool negation) {
  int32_t sign = negation ? -1 : 1;

  if (child->GetType() == SENode::Constant) {
    // Collect all the constants and add them together.
    constant_accumulator_ +=
        child->AsSEConstantNode()->FoldToSingleValue() * sign;

  } else if (child->GetType() == SENode::ValueUnknown ||
             child->GetType() == SENode::RecurrentAddExpr) {
    // To rebuild the graph of X+X+X*2 into 4*X we count the occurrences of X
    // and create a new node of count*X after. X can either be a ValueUnknown or
    // a RecurrentAddExpr. The count for each X is stored in the accumulators_
    // map.

    auto iterator = accumulators_.find(child);
    // If we've encountered this term before add to the accumulator for it.
    if (iterator == accumulators_.end())
      accumulators_.insert({child, sign});
    else
      iterator->second += sign;

  } else if (child->GetType() == SENode::Multiply) {
    if (!AccumulatorsFromMultiply(child, negation)) {
      new_node->AddChild(child);
    }

  } else if (child->GetType() == SENode::Add) {
    for (SENode* next_child : *child) {
      GatherAccumulatorsFromChildNodes(new_node, next_child, negation);
    }

  } else if (child->GetType() == SENode::Negative) {
    SENode* negated_node = child->GetChild(0);
    GatherAccumulatorsFromChildNodes(new_node, negated_node, !negation);
  } else {
    // If we can't work out how to fold the expression just add it back into
    // the graph.
    new_node->AddChild(child);
  }
}